

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall
MemoryLeakDetector::checkForCorruption
          (MemoryLeakDetector *this,MemoryLeakDetectorNode *node,char *file,size_t line,
          TestMemoryAllocator *allocator,bool allocateNodesSeperately)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestMemoryAllocator *freeAllocator;
  undefined4 extraout_var_02;
  size_t allocLine;
  char *pcVar5;
  char *message;
  size_t sVar6;
  TestMemoryAllocator *allocAllocator;
  long *plVar4;
  undefined4 extraout_var_01;
  
  iVar2 = (*node->allocator_->_vptr_TestMemoryAllocator[10])();
  iVar3 = (*allocator->_vptr_TestMemoryAllocator[10])(allocator);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
  if ((((long *)CONCAT44(extraout_var,iVar2) == plVar4) || (this->doAllocationTypeChecking_ != true)
      ) || (cVar1 = (**(code **)(*plVar4 + 0x38))(plVar4,(long *)CONCAT44(extraout_var,iVar2)),
           cVar1 != '\0')) {
    sVar6 = node->size_;
    pcVar5 = node->memory_;
    if (((pcVar5[sVar6] == 'B') && (pcVar5[sVar6 + 1] == 'A')) && (pcVar5[sVar6 + 2] == 'S')) {
      if (!allocateNodesSeperately) {
        return;
      }
      (*allocator->_vptr_TestMemoryAllocator[9])(allocator,node);
      return;
    }
    iVar2 = (*allocator->_vptr_TestMemoryAllocator[10])(allocator);
    freeAllocator = (TestMemoryAllocator *)CONCAT44(extraout_var_01,iVar2);
    sVar6 = node->size_;
    pcVar5 = node->file_;
    allocLine = node->line_;
    allocAllocator = node->allocator_;
    message = "Memory corruption (written out of bounds?)\n";
  }
  else {
    iVar2 = (*allocator->_vptr_TestMemoryAllocator[10])(allocator);
    freeAllocator = (TestMemoryAllocator *)CONCAT44(extraout_var_02,iVar2);
    sVar6 = node->size_;
    pcVar5 = node->file_;
    allocLine = node->line_;
    allocAllocator = node->allocator_;
    message = "Allocation/deallocation type mismatch\n";
  }
  MemoryLeakOutputStringBuffer::reportFailure
            (&this->outputBuffer_,message,pcVar5,allocLine,sVar6,allocAllocator,file,line,
             freeAllocator,this->reporter_);
  return;
}

Assistant:

void MemoryLeakDetector::checkForCorruption(MemoryLeakDetectorNode* node, const char* file, size_t line, TestMemoryAllocator* allocator, bool allocateNodesSeperately)
{
    if (!matchingAllocation(node->allocator_->actualAllocator(), allocator->actualAllocator()))
        outputBuffer_.reportAllocationDeallocationMismatchFailure(node, file, line, allocator->actualAllocator(), reporter_);
    else if (!validMemoryCorruptionInformation(node->memory_ + node->size_))
        outputBuffer_.reportMemoryCorruptionFailure(node, file, line, allocator->actualAllocator(), reporter_);
    else if (allocateNodesSeperately)
        allocator->freeMemoryLeakNode((char*) node);
}